

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel2DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec2 *coord,int coordZ,IVec4 *result)

{
  int c;
  bool bVar1;
  int ndx;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vector<int,_4> res;
  Vector<int,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_8c;
  undefined4 local_7c;
  int local_78;
  undefined4 local_74;
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  tcu local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar8 = floorf(local_38);
  fVar9 = floorf(local_34);
  fVar10 = floorf(local_40);
  local_8c = (int)fVar10;
  fVar10 = floorf(local_3c);
  local_6c = (int)fVar10;
  bVar1 = local_8c <= local_6c;
  if (local_8c <= local_6c) {
    local_78 = (int)fVar8;
    bVar1 = true;
    c = local_78;
    do {
      for (; c <= (int)fVar9; c = c + 1) {
        iVar2 = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
        iVar3 = TexVerifierUtil::wrap(sampler->wrapT,local_8c,(access->m_size).m_data[1]);
        if ((((iVar2 < 0) || ((access->m_size).m_data[0] <= iVar2)) || (iVar3 < 0)) ||
           ((((access->m_size).m_data[1] <= iVar3 || (coordZ < 0)) ||
            ((access->m_size).m_data[2] <= coordZ)))) {
          sampleTextureBorder<int>(local_50,&access->m_format,sampler);
        }
        else {
          ConstPixelBufferAccess::getPixelT<int>
                    ((ConstPixelBufferAccess *)local_50,(int)access,iVar2,iVar3);
        }
        local_68 = 0;
        uStack_60 = 0;
        lVar4 = 0;
        do {
          iVar2 = *(int *)(local_50 + lVar4 * 4);
          iVar3 = result->m_data[lVar4];
          iVar6 = iVar2 - iVar3;
          if (iVar2 - iVar3 == 0 || iVar2 < iVar3) {
            iVar6 = -(iVar2 - iVar3);
          }
          *(int *)((long)&local_68 + lVar4 * 4) = iVar6;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_70 = 0;
        lVar4 = 0;
        do {
          *(bool *)((long)&local_70 + lVar4) =
               *(uint *)((long)&local_68 + lVar4 * 4) <= (prec->colorThreshold).m_data[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_74 = 0;
        lVar4 = 0;
        do {
          *(byte *)((long)&local_74 + lVar4) = (prec->colorMask).m_data[lVar4] ^ 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_7c = 0;
        lVar4 = 0;
        do {
          *(byte *)((long)&local_7c + lVar4) =
               *(byte *)((long)&local_74 + lVar4) | *(byte *)((long)&local_70 + lVar4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        if ((char)local_7c != '\0') {
          uVar5 = 0xffffffffffffffff;
          do {
            if (uVar5 == 2) {
              uVar7 = 3;
              break;
            }
            uVar7 = uVar5 + 1;
            lVar4 = uVar5 + 2;
            uVar5 = uVar7;
          } while (*(char *)((long)&local_7c + lVar4) != '\0');
          if (2 < uVar7) {
            return bVar1;
          }
        }
      }
      local_8c = local_8c + 1;
      bVar1 = local_8c <= local_6c;
      c = local_78;
    } while (local_8c <= local_6c);
  }
  return bVar1;
}

Assistant:

bool isLevel2DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec2&					coord,
								 const int						coordZ,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, coordZ, result);
}